

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_base64.cpp
# Opt level: O3

void Omega_h::base64::anon_unknown_0::decode_4(char *in,uchar *out,size_t nout)

{
  byte bVar1;
  undefined8 in_RAX;
  long lVar2;
  uchar val [4];
  byte local_4 [4];
  
  lVar2 = 0;
  do {
    bVar1 = (anonymous_namespace)::char_to_value[(uint)(int)in[lVar2]];
    local_4[lVar2] = bVar1;
    if (0x3f < bVar1) {
      fail("assertion %s failed at %s +%d\n","val[i] < 64",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_base64.cpp"
           ,0x4b);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_4[0] = (byte)((ulong)in_RAX >> 0x20);
  local_4[1] = (byte)((ulong)in_RAX >> 0x28);
  *out = local_4[1] >> 4 & 3 | local_4[0] << 2;
  if (1 < nout) {
    local_4[2] = (byte)((ulong)in_RAX >> 0x30);
    out[1] = local_4[2] >> 2 & 0xf | local_4[1] << 4;
    if (nout != 2) {
      local_4[3] = (byte)((ulong)in_RAX >> 0x38);
      out[2] = local_4[3] & 0x3f | local_4[2] << 6;
    }
  }
  return;
}

Assistant:

void decode_4(char const* in, unsigned char* out, std::size_t nout = 3) {
  unsigned char val[4];
  for (unsigned i = 0; i < 4; ++i) {
    val[i] = char_to_value[U(in[i])];
    OMEGA_H_CHECK(val[i] < 64);
  }
  /* cast it all !
   * (technically this should all be run as
   *  unsigned char, but apparently it gets pushed
   *  up to int if we try that, so run it all as unsigned
   *  and cast back which we know is safe) */
  out[0] =
      UC(((U(val[0]) << U(2)) & U(0xFC)) | ((U(val[1]) >> U(4)) & U(0x03)));
  if (nout < 2) return;
  out[1] =
      UC(((U(val[1]) << U(4)) & U(0xF0)) | ((U(val[2]) >> U(2)) & U(0x0F)));
  if (nout < 3) return;
  out[2] =
      UC(((U(val[2]) << U(6)) & U(0xC0)) | ((U(val[3]) >> U(0)) & U(0x3F)));
}